

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_cell_tuv_supported(REF_GEOM ref_geom,REF_INT *nodes,REF_INT type,REF_BOOL *supported)

{
  REF_INT id;
  int iVar1;
  uint uVar2;
  REF_INT *pRVar3;
  long lVar4;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT geom1;
  REF_INT geom0;
  REF_BOOL tri_supported;
  REF_INT geom2;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  REF_BOOL *local_38;
  
  *supported = 1;
  if (1 < type - 1U) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2c4,
           "ref_geom_cell_tuv_supported","type not allowed");
    return 1;
  }
  id = nodes[(ulong)(uint)type + 1];
  if (type == 2) {
    uVar2 = ref_geom_tri_supported(ref_geom,nodes,&local_40);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2ca,
             "ref_geom_cell_tuv_supported",(ulong)uVar2,"tri support");
      return uVar2;
    }
    if (local_40 == 0) {
      *supported = 1;
      return 0;
    }
  }
  local_38 = supported;
  uVar2 = ref_geom_find(ref_geom,*nodes,type,id,&local_44);
  if (type == 1) {
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2d3,
             "ref_geom_cell_tuv_supported",(ulong)uVar2,"not found");
      return uVar2;
    }
    uVar2 = ref_geom_find(ref_geom,nodes[1],1,id,&local_48);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2d4,
             "ref_geom_cell_tuv_supported",(ulong)uVar2,"not found");
      return uVar2;
    }
    pRVar3 = ref_geom->descr;
    if (pRVar3[(long)local_44 * 6 + 3] != 0) goto LAB_0018b74d;
    iVar1 = pRVar3[(long)local_44 * 6 + 4];
  }
  else {
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2de,
             "ref_geom_cell_tuv_supported",(ulong)uVar2,"not found");
      return uVar2;
    }
    uVar2 = ref_geom_find(ref_geom,nodes[1],type,id,&local_48);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2df,
             "ref_geom_cell_tuv_supported",(ulong)uVar2,"not found");
      return uVar2;
    }
    uVar2 = ref_geom_find(ref_geom,nodes[2],type,id,&local_3c);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2e0,
             "ref_geom_cell_tuv_supported",(ulong)uVar2,"not found");
      return uVar2;
    }
    pRVar3 = ref_geom->descr;
    if ((pRVar3[(long)local_44 * 6 + 3] == 0) && (pRVar3[(long)local_44 * 6 + 4] == 0)) {
      return 0;
    }
    lVar4 = (long)local_48;
    local_48 = local_3c;
    if (pRVar3[lVar4 * 6 + 3] != 0) goto LAB_0018b74d;
    iVar1 = pRVar3[lVar4 * 6 + 4];
  }
  if (iVar1 == 0) {
    return 0;
  }
LAB_0018b74d:
  if ((pRVar3[(long)local_48 * 6 + 3] != 0) || (pRVar3[(long)local_48 * 6 + 4] != 0)) {
    *local_38 = 0;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_cell_tuv_supported(REF_GEOM ref_geom,
                                               REF_INT *nodes, REF_INT type,
                                               REF_BOOL *supported) {
  REF_INT node_per;
  REF_INT id, geom0, geom1, geom2;
  REF_BOOL tri_supported;

  *supported = REF_TRUE;

  RAS(1 <= type && type <= 2, "type not allowed");
  node_per = type + 1;
  id = nodes[node_per];

  /* protects unsupported meshlink tri */
  if (REF_GEOM_FACE == type) {
    RSS(ref_geom_tri_supported(ref_geom, nodes, &tri_supported), "tri support");
    if (!tri_supported) { /* no geom support */
      *supported = 1.0;
      return REF_SUCCESS;
    }
  }

  switch (type) {
    case REF_GEOM_EDGE:
      RSS(ref_geom_find(ref_geom, nodes[0], type, id, &geom0), "not found");
      RSS(ref_geom_find(ref_geom, nodes[1], type, id, &geom1), "not found");

      if ((0 != ref_geom_jump(ref_geom, geom0) ||
           0 != ref_geom_degen(ref_geom, geom0)) &&
          (0 != ref_geom_jump(ref_geom, geom1) ||
           0 != ref_geom_degen(ref_geom, geom1))) {
        *supported = REF_FALSE;
      }
      break;
    case REF_GEOM_FACE:
      RSS(ref_geom_find(ref_geom, nodes[0], type, id, &geom0), "not found");
      RSS(ref_geom_find(ref_geom, nodes[1], type, id, &geom1), "not found");
      RSS(ref_geom_find(ref_geom, nodes[2], type, id, &geom2), "not found");
      if ((0 != ref_geom_jump(ref_geom, geom0) ||
           0 != ref_geom_degen(ref_geom, geom0)) &&
          (0 != ref_geom_jump(ref_geom, geom1) ||
           0 != ref_geom_degen(ref_geom, geom1)) &&
          (0 != ref_geom_jump(ref_geom, geom2) ||
           0 != ref_geom_degen(ref_geom, geom2))) {
        *supported = REF_FALSE;
      }
      break;
    default:
      RSS(REF_IMPLEMENT, "can't to geom type yet");
  }

  return REF_SUCCESS;
}